

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.c
# Opt level: O0

void appPaint(ATimeUs timestamp,float dt)

{
  float fVar1;
  float local_1c;
  float local_18;
  float sec;
  float dt_local;
  ATimeUs timestamp_local;
  
  fps.dt = dt + fps.dt;
  local_18 = dt;
  if ((fps.min_dt <= dt) && ((fps.min_dt != 0.0 || (NAN(fps.min_dt))))) {
    local_18 = fps.min_dt;
  }
  fps.min_dt = local_18;
  local_1c = dt;
  if (dt <= fps.max_dt) {
    local_1c = fps.max_dt;
  }
  fps.max_dt = local_1c;
  fps.frames = fps.frames + 1;
  if (1000000 < timestamp - fps.time) {
    fVar1 = (float)(timestamp - fps.time) * 1e-06;
    aAppDebugPrintf("%s[%u]: elapsed: %.2fs, frames = %d, min_dt = %.2fms, avg_dt = %.2fms, max_dt = %.2fms, avg_fps = %.2f"
                    ,(double)fVar1,(double)local_18 * 1000.0,
                    ((double)fps.dt * 1000.0) / (double)fps.frames,(double)local_1c * 1000.0,
                    (double)((float)fps.frames / fVar1),"appPaint",(ulong)timestamp,
                    (ulong)(uint)fps.frames);
    fps.frames = 0;
    fps.max_dt = 0.0;
    fps.dt = 0.0;
    fps.min_dt = 0.0;
    fps.time = timestamp;
  }
  return;
}

Assistant:

static void appPaint(ATimeUs timestamp, float dt) {
	fps.dt += dt;
	fps.min_dt = (fps.min_dt > dt || !fps.min_dt) ? dt : fps.min_dt;
	fps.max_dt = (fps.max_dt < dt) ? dt : fps.max_dt;
	++fps.frames;
	if (timestamp - fps.time > 1000000) {
		float sec = (timestamp - fps.time) * 1e-6f;
		aAppDebugPrintf(
			"%s[%u]: elapsed: %.2fs, frames = %d, "
			"min_dt = %.2fms, avg_dt = %.2fms, max_dt = %.2fms, avg_fps = %.2f",
			__func__, timestamp, sec, fps.frames, fps.min_dt * 1e3, fps.dt * 1e3 / fps.frames, fps.max_dt * 1e3,
			fps.frames / sec);
		fps.frames = 0;
		fps.min_dt = fps.dt = fps.max_dt = 0;
		fps.time = timestamp;
	}
}